

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool __thiscall
GlobOpt::ProcessPropOpInTypeCheckSeq<false>
          (GlobOpt *this,Instr *instr,PropertySymOpnd *opnd,BasicBlock *block,
          bool updateExistingValue,bool *emitsTypeCheckOut,bool *changesTypeValueOut,
          bool *isTypeCheckedOut)

{
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  uint16 uVar7;
  uint16 uVar8;
  undefined4 *puVar9;
  PropertySymOpnd *pPVar10;
  StackSym *typeSym_00;
  JsTypeValueInfo *this_00;
  ValueInfo *pVVar11;
  Value *this_01;
  EquivalentTypeSet *pEVar12;
  EquivalentTypeSet *pEVar13;
  bool local_26a;
  bool local_269;
  bool local_22a;
  bool local_229;
  bool local_219;
  bool local_1d9;
  bool local_1d8;
  byte local_1d7;
  bool local_1d6;
  bool local_1d5;
  bool local_1d4;
  byte local_1d1;
  JsTypeValueInfo *local_1d0;
  JITTypeHolderBase<void> local_1b8;
  JITTypeHolderBase<void> local_1b0;
  JsTypeValueInfo *local_1a8;
  JsTypeValueInfo *valueInfoAfter;
  Value *valueAfter;
  uint16 typeCheckSeqFlagsAfter;
  PropertySym *propertySym;
  Type local_178;
  Type local_170;
  nullptr_t local_168;
  JITTypeHolderBase<void> local_160 [3];
  nullptr_t local_148;
  JITTypeHolderBase<void> local_140;
  Type local_138;
  ushort local_12a;
  EquivalentTypeSet *pEStack_128;
  uint16 i;
  EquivalentTypeSet *typeSet;
  nullptr_t local_118;
  JITTypeHolderBase<void> local_110;
  bool local_105;
  uint16 local_104;
  uint16 local_102;
  bool auxSlot;
  uint16 slotIndex;
  EquivalentTypeSet *pEStack_100;
  uint16 checkedTypeSetIndex;
  EquivalentTypeSet *opndTypeSet;
  Type local_f0;
  Type local_e0;
  EquivalentTypeSet *local_d8;
  EquivalentTypeSet *valueTypeSet;
  bool local_c1;
  JITTypeHolder JStack_c0;
  bool objectMayHaveAcquiredAdditionalProperties;
  JITTypeHolderBase<void> local_b8;
  JITTypeHolder valueType;
  JITTypeHolderBase<void> local_a8 [2];
  nullptr_t local_98;
  JITTypeHolderBase<void> local_90;
  JITTypeHolderBase<void> local_88;
  JITTypeHolder opndType;
  bool doEquivTypeCheck;
  JsTypeValueInfo *valueInfo;
  Value *value;
  JsTypeValueInfo *valueInfoBefore;
  Value *valueBefore;
  uint16 typeCheckSeqFlagsBefore;
  StackSym *typeSym;
  bool addsProperty;
  bool emitsTypeCheck;
  bool isSpecialized;
  bool produceType;
  bool consumeType;
  bool isTypeDead;
  bool isStore;
  bool *emitsTypeCheckOut_local;
  BasicBlock *pBStack_30;
  bool updateExistingValue_local;
  BasicBlock *block_local;
  PropertySymOpnd *opnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  bVar3 = IR::PropertySymOpnd::IsTypeDead(opnd);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x489,"(!opnd->IsTypeDead())","!opnd->IsTypeDead()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x48b,"(opnd->IsTypeCheckSeqCandidate())","opnd->IsTypeCheckSeqCandidate()")
    ;
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = IR::PropertySymOpnd::HasObjectTypeSym(opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x48c,"(opnd->HasObjectTypeSym())","opnd->HasObjectTypeSym()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pPVar10 = (PropertySymOpnd *)IR::Instr::GetDst(instr);
  bVar3 = IR::PropertySymOpnd::IsTypeDead(opnd);
  typeSym._2_1_ = false;
  typeSym._1_1_ = false;
  pBStack_30 = block;
  if (block == (BasicBlock *)0x0) {
    pBStack_30 = this->currentBlock;
  }
  typeSym_00 = IR::PropertySymOpnd::GetObjectTypeSym(opnd);
  value = (Value *)0x0;
  uVar7 = IR::PropertySymOpnd::GetTypeCheckSeqFlags(opnd);
  this_00 = (JsTypeValueInfo *)
            GlobOptBlockData::FindObjectTypeValue(&pBStack_30->globOptData,typeSym_00);
  if (this_00 != (JsTypeValueInfo *)0x0) {
    pVVar11 = ::Value::GetValueInfo((Value *)this_00);
    if (pVVar11 == (ValueInfo *)0x0) {
LAB_00607765:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x4a7,
                         "(valueBefore->GetValueInfo() != nullptr && valueBefore->GetValueInfo()->IsJsType())"
                         ,
                         "valueBefore->GetValueInfo() != nullptr && valueBefore->GetValueInfo()->IsJsType()"
                        );
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    else {
      pVVar11 = ::Value::GetValueInfo((Value *)this_00);
      bVar4 = ValueInfo::IsJsType(pVVar11);
      if (!bVar4) goto LAB_00607765;
    }
    pVVar11 = ::Value::GetValueInfo((Value *)this_00);
    value = (Value *)ValueInfo::AsJsType(pVVar11);
  }
  this_01 = GlobOptBlockData::FindObjectTypeValue(&pBStack_30->globOptData,typeSym_00);
  if (this_01 == (Value *)0x0) {
    local_1d0 = (JsTypeValueInfo *)0x0;
  }
  else {
    pVVar11 = ::Value::GetValueInfo(this_01);
    local_1d0 = ValueInfo::AsJsType(pVVar11);
  }
  bVar4 = IR::PropertySymOpnd::HasTypeMismatch(opnd);
  if (bVar4) {
    if (emitsTypeCheckOut != (bool *)0x0) {
      *emitsTypeCheckOut = false;
    }
    if (changesTypeValueOut != (bool *)0x0) {
      *changesTypeValueOut = false;
    }
    return false;
  }
  bVar4 = IR::PropertySymOpnd::HasEquivalentTypeSet(opnd);
  local_1d1 = 0;
  if (bVar4) {
    bVar4 = IR::PropertySymOpnd::NeedsMonoCheck(opnd);
    local_1d1 = bVar4 ^ 0xff;
  }
  opndType.t._7_1_ = local_1d1 & 1;
  if (opndType.t._7_1_ == 0) {
    bVar4 = IR::PropertySymOpnd::NeedsDepolymorphication(opnd);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x4c5,"(!opnd->NeedsDepolymorphication())",
                         "!opnd->NeedsDepolymorphication()");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    local_88.t = (Type)IR::PropertySymOpnd::GetType(opnd);
    bVar4 = true;
    if (local_1d0 != (JsTypeValueInfo *)0x0) {
      local_90.t = (Type)JsTypeValueInfo::GetJsType(local_1d0);
      local_98 = (nullptr_t)0x0;
      bVar5 = JITTypeHolderBase<void>::operator==(&local_90,&local_98);
      bVar4 = false;
      if (bVar5) {
        pEVar12 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
        bVar4 = pEVar12 == (EquivalentTypeSet *)0x0;
      }
    }
    if (bVar4) {
      IR::PropertySymOpnd::SetTypeAvailable(opnd,false);
      typeSym._2_1_ = (bool)((bVar3 ^ 0xffU) & 1);
      local_1d4 = false;
      if ((opnd == pPVar10) && (local_1d4 = false, typeSym._2_1_ != false)) {
        local_1d4 = IR::PropertySymOpnd::HasInitialType(opnd);
      }
      typeSym._1_1_ = local_1d4;
      typeSym._3_1_ = typeSym._2_1_;
    }
    else {
      local_a8[0].t = (Type)JsTypeValueInfo::GetJsType(local_1d0);
      valueType.t = (Type)0x0;
      bVar4 = JITTypeHolderBase<void>::operator!=(local_a8,&valueType.t);
      if (bVar4) {
        local_b8.t = (Type)JsTypeValueInfo::GetJsType(local_1d0);
        bVar4 = JITTypeHolderBase<void>::operator==(&local_b8,&local_88);
        if (bVar4) {
          typeSym._3_1_ = true;
          if (isTypeCheckedOut != (bool *)0x0) {
            *isTypeCheckedOut = true;
          }
        }
        else {
          bVar4 = IR::PropertySymOpnd::HasInitialType(opnd);
          local_1d5 = false;
          if (bVar4) {
            JStack_c0 = IR::PropertySymOpnd::GetInitialType(opnd);
            local_1d5 = JITTypeHolderBase<void>::operator==(&local_b8,&stack0xffffffffffffff40);
          }
          if (local_1d5 == false) {
            typeSym._3_1_ = false;
            typeSym._1_1_ = typeSym._3_1_;
          }
          else {
            local_1d6 = false;
            if ((pBStack_30->globOptData).maybeWrittenTypeSyms !=
                (BVSparse<Memory::JitArenaAllocator> *)0x0) {
              BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                ((pBStack_30->globOptData).maybeWrittenTypeSyms,
                                 (typeSym_00->super_Sym).m_id);
              local_1d6 = BVar6 != '\0';
            }
            local_c1 = local_1d6;
            local_1d7 = 1;
            if (bVar3) {
              local_1d7 = local_1d6 ^ 0xff;
            }
            typeSym._1_1_ = (bool)(local_1d7 & 1);
            local_1d8 = false;
            if (typeSym._1_1_ != false) {
              local_1d8 = local_1d6;
            }
            typeSym._2_1_ = local_1d8;
            typeSym._3_1_ = typeSym._1_1_;
            if (isTypeCheckedOut != (bool *)0x0) {
              *isTypeCheckedOut = (bool)((local_1d6 ^ 0xffU) & 1);
            }
          }
        }
      }
      else {
        pEVar12 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
        if (pEVar12 == (EquivalentTypeSet *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x510,"(valueInfo->GetJsTypeSet())","valueInfo->GetJsTypeSet()");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        local_d8 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
        local_e0 = local_88.t;
        bVar4 = Js::EquivalentTypeSet::Contains(local_d8,(JITTypeHolder)local_88.t,(uint16 *)0x0);
        if (bVar4) {
          typeSym._2_1_ = (bool)((bVar3 ^ 0xffU) & 1);
          typeSym._3_1_ = typeSym._2_1_;
        }
        else {
          bVar4 = IR::PropertySymOpnd::HasInitialType(opnd);
          pEVar12 = local_d8;
          local_1d9 = false;
          if (bVar4) {
            local_f0 = (Type)IR::PropertySymOpnd::GetInitialType(opnd);
            local_1d9 = Js::EquivalentTypeSet::Contains
                                  (pEVar12,(JITTypeHolder)local_f0,(uint16 *)0x0);
          }
          if (local_1d9 == false) {
            typeSym._3_1_ = false;
            typeSym._1_1_ = typeSym._3_1_;
            typeSym._2_1_ = typeSym._3_1_;
          }
          else {
            typeSym._1_1_ = (bool)((bVar3 ^ 0xffU) & 1);
            typeSym._2_1_ = typeSym._1_1_;
            typeSym._3_1_ = typeSym._1_1_;
          }
        }
      }
    }
  }
  else {
    bVar4 = IR::PropertySymOpnd::NeedsMonoCheck(opnd);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x53b,"(!opnd->NeedsMonoCheck())","!opnd->NeedsMonoCheck()");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pEStack_100 = IR::PropertySymOpnd::GetEquivalentTypeSet(opnd);
    local_102 = 0xffff;
    bVar4 = IR::PropertySymOpnd::NeedsDepolymorphication(opnd);
    if (bVar4) {
      local_104 = 0xffff;
      local_105 = false;
      if (local_1d0 != (JsTypeValueInfo *)0x0) {
        local_110.t = (Type)JsTypeValueInfo::GetJsType(local_1d0);
        local_118 = (nullptr_t)0x0;
        bVar3 = JITTypeHolderBase<void>::operator!=(&local_110,&local_118);
        if (bVar3) {
          typeSet = (EquivalentTypeSet *)JsTypeValueInfo::GetJsType(local_1d0);
          IR::PropertySymOpnd::TryDepolymorphication
                    (opnd,(JITTypeHolder)typeSet,0xffff,false,&local_104,&local_105,&local_102);
        }
        else {
          pEVar12 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
          if (pEVar12 != (EquivalentTypeSet *)0x0) {
            pEStack_128 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
            for (local_12a = 0; uVar2 = local_12a,
                uVar8 = Js::EquivalentTypeSet::GetCount(pEStack_128), uVar2 < uVar8;
                local_12a = local_12a + 1) {
              local_138 = (Type)Js::EquivalentTypeSet::GetType(pEStack_128,local_12a);
              IR::PropertySymOpnd::TryDepolymorphication
                        (opnd,(JITTypeHolder)local_138,local_104,(bool)(local_105 & 1),&local_104,
                         &local_105,(uint16 *)0x0);
              if (local_104 == 0xffff) break;
            }
          }
        }
      }
      if (local_104 == 0xffff) {
        typeSym._3_1_ = false;
      }
      else {
        typeSym._3_1_ = true;
        if (isTypeCheckedOut != (bool *)0x0) {
          *isTypeCheckedOut = true;
        }
      }
    }
    else {
      bVar4 = true;
      if (local_1d0 != (JsTypeValueInfo *)0x0) {
        local_140.t = (Type)JsTypeValueInfo::GetJsType(local_1d0);
        local_148 = (nullptr_t)0x0;
        bVar5 = JITTypeHolderBase<void>::operator==(&local_140,&local_148);
        bVar4 = false;
        if (bVar5) {
          pEVar12 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
          bVar4 = pEVar12 == (EquivalentTypeSet *)0x0;
        }
      }
      if (bVar4) {
        typeSym._2_1_ = (bool)((bVar3 ^ 0xffU) & 1);
        typeSym._3_1_ = typeSym._2_1_;
      }
      else {
        local_160[0].t = (Type)JsTypeValueInfo::GetJsType(local_1d0);
        local_168 = (nullptr_t)0x0;
        bVar4 = JITTypeHolderBase<void>::operator!=(local_160,&local_168);
        pEVar12 = pEStack_100;
        if (bVar4) {
          local_170 = (Type)JsTypeValueInfo::GetJsType(local_1d0);
          local_219 = Js::EquivalentTypeSet::Contains(pEVar12,(JITTypeHolder)local_170,&local_102);
        }
        else {
          pEVar12 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
          local_219 = IsSubsetOf(pEVar12,pEStack_100);
        }
        if (local_219 == false) {
          pEVar12 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
          local_229 = false;
          if (pEVar12 != (EquivalentTypeSet *)0x0) {
            bVar4 = IR::PropertySymOpnd::IsMono(opnd);
            pEVar12 = pEStack_100;
            if (bVar4) {
              pEVar12 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
              local_178 = (Type)IR::PropertySymOpnd::GetFirstEquivalentType(opnd);
              local_22a = Js::EquivalentTypeSet::Contains
                                    (pEVar12,(JITTypeHolder)local_178,(uint16 *)0x0);
            }
            else {
              pEVar13 = JsTypeValueInfo::GetJsTypeSet(local_1d0);
              local_22a = IsSubsetOf(pEVar12,pEVar13);
            }
            local_229 = local_22a;
          }
          if (local_229 == false) {
            typeSym._3_1_ = false;
            typeSym._2_1_ = typeSym._3_1_;
          }
          else {
            typeSym._2_1_ = (bool)((bVar3 ^ 0xffU) & 1);
            typeSym._3_1_ = typeSym._2_1_;
          }
        }
        else {
          typeSym._3_1_ = true;
          if (isTypeCheckedOut != (bool *)0x0) {
            *isTypeCheckedOut = true;
          }
          if (local_102 != 0xffff) {
            IR::PropertySymOpnd::SetCheckedTypeSetIndex(opnd,local_102);
          }
        }
      }
    }
  }
  if ((typeSym._3_1_ == false) && ((typeSym._2_1_ != false || (typeSym._1_1_ != false)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x5d0,"(isSpecialized || (!emitsTypeCheck && !addsProperty))",
                       "isSpecialized || (!emitsTypeCheck && !addsProperty)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  valueAfter._6_2_ = IR::PropertySymOpnd::GetTypeCheckSeqFlags(opnd);
  if (uVar7 != valueAfter._6_2_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x617,"(typeCheckSeqFlagsBefore == typeCheckSeqFlagsAfter)",
                       "typeCheckSeqFlagsBefore == typeCheckSeqFlagsAfter");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  valueInfoAfter =
       (JsTypeValueInfo *)GlobOptBlockData::FindObjectTypeValue(&pBStack_30->globOptData,typeSym_00)
  ;
  if (this_00 != valueInfoAfter) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x61a,"(valueBefore == valueAfter)","valueBefore == valueAfter");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (valueInfoAfter == (JsTypeValueInfo *)0x0) goto LAB_00608b41;
  if (this_00 == (JsTypeValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x61d,"(valueBefore != nullptr)","valueBefore != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pVVar11 = ::Value::GetValueInfo((Value *)valueInfoAfter);
  if (pVVar11 == (ValueInfo *)0x0) {
LAB_006088f6:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x61e,
                       "(valueAfter->GetValueInfo() != nullptr && valueAfter->GetValueInfo()->IsJsType())"
                       ,
                       "valueAfter->GetValueInfo() != nullptr && valueAfter->GetValueInfo()->IsJsType()"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  else {
    pVVar11 = ::Value::GetValueInfo((Value *)valueInfoAfter);
    bVar3 = ValueInfo::IsJsType(pVVar11);
    if (!bVar3) goto LAB_006088f6;
  }
  pVVar11 = ::Value::GetValueInfo((Value *)valueInfoAfter);
  local_1a8 = ValueInfo::AsJsType(pVVar11);
  if ((JsTypeValueInfo *)value != local_1a8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x620,"(valueInfoBefore == valueInfoAfter)",
                       "valueInfoBefore == valueInfoAfter");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  local_1b0.t = (Type)JsTypeValueInfo::GetJsType((JsTypeValueInfo *)value);
  local_1b8.t = (Type)JsTypeValueInfo::GetJsType(local_1a8);
  bVar3 = JITTypeHolderBase<void>::operator==(&local_1b0,&local_1b8);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x621,"(valueInfoBefore->GetJsType() == valueInfoAfter->GetJsType())",
                       "valueInfoBefore->GetJsType() == valueInfoAfter->GetJsType()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pEVar12 = JsTypeValueInfo::GetJsTypeSet((JsTypeValueInfo *)value);
  pEVar13 = JsTypeValueInfo::GetJsTypeSet(local_1a8);
  if (pEVar12 != pEVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x622,"(valueInfoBefore->GetJsTypeSet() == valueInfoAfter->GetJsTypeSet())",
                       "valueInfoBefore->GetJsTypeSet() == valueInfoAfter->GetJsTypeSet()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
LAB_00608b41:
  if (emitsTypeCheckOut != (bool *)0x0) {
    *emitsTypeCheckOut = typeSym._2_1_;
  }
  if (changesTypeValueOut != (bool *)0x0) {
    local_269 = false;
    if (typeSym._3_1_ != false) {
      local_26a = true;
      if (typeSym._2_1_ == false) {
        local_26a = typeSym._1_1_;
      }
      local_269 = local_26a;
    }
    *changesTypeValueOut = local_269;
  }
  return typeSym._3_1_;
}

Assistant:

bool
GlobOpt::ProcessPropOpInTypeCheckSeq(IR::Instr* instr, IR::PropertySymOpnd *opnd, BasicBlock* block, bool updateExistingValue, bool* emitsTypeCheckOut, bool* changesTypeValueOut, bool *isTypeCheckedOut)
{
    // We no longer mark types as dead in the backward pass, so we should never see an instr with a dead type here
    // during the forward pass. For the time being we've retained the logic below to deal with dead types in case
    // we ever wanted to revert back to more aggressive type killing that we had before.
    Assert(!opnd->IsTypeDead());

    Assert(opnd->IsTypeCheckSeqCandidate());
    Assert(opnd->HasObjectTypeSym());

    bool isStore = opnd == instr->GetDst();
    bool isTypeDead = opnd->IsTypeDead();
    bool consumeType = makeChanges && !IsLoopPrePass();
    bool produceType = makeChanges && !isTypeDead;
    bool isSpecialized = false;
    bool emitsTypeCheck = false;
    bool addsProperty = false;

    if (block == nullptr)
    {
        block = this->currentBlock;
    }

    StackSym * typeSym = opnd->GetObjectTypeSym();

#if DBG
    uint16 typeCheckSeqFlagsBefore;
    Value* valueBefore = nullptr;
    JsTypeValueInfo* valueInfoBefore = nullptr;
    if (!makeChanges)
    {
        typeCheckSeqFlagsBefore = opnd->GetTypeCheckSeqFlags();
        valueBefore = block->globOptData.FindObjectTypeValue(typeSym);
        if (valueBefore != nullptr)
        {
            Assert(valueBefore->GetValueInfo() != nullptr && valueBefore->GetValueInfo()->IsJsType());
            valueInfoBefore = valueBefore->GetValueInfo()->AsJsType();
        }
    }
#endif

    Value *value = block->globOptData.FindObjectTypeValue(typeSym);
    JsTypeValueInfo* valueInfo = value != nullptr ? value->GetValueInfo()->AsJsType() : nullptr;

    if (consumeType && valueInfo != nullptr)
    {
        opnd->SetTypeAvailable(true);
    }

    if (opnd->HasTypeMismatch())
    {
        if (emitsTypeCheckOut != nullptr)
        {
            *emitsTypeCheckOut = false;
        }
        if (changesTypeValueOut != nullptr)
        {
            *changesTypeValueOut = false;
        }
        return false;
    }

    bool doEquivTypeCheck = opnd->HasEquivalentTypeSet() && !opnd->NeedsMonoCheck();
    if (!doEquivTypeCheck)
    {
        AssertOrFailFast(!opnd->NeedsDepolymorphication());

        // We need a monomorphic type check here (e.g., final type opt, fixed field check on non-proto property).
        JITTypeHolder opndType = opnd->GetType();

        if (valueInfo == nullptr || (valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr))
        {
            // This is the initial type check.
            opnd->SetTypeAvailable(false);
            isSpecialized = !isTypeDead;
            emitsTypeCheck = isSpecialized;
            addsProperty = isStore && isSpecialized && opnd->HasInitialType();
            if (produceType)
            {
                SetObjectTypeFromTypeSym(typeSym, opndType, nullptr, block, updateExistingValue);
            }
        }
        else if (valueInfo->GetJsType() != nullptr)
        {
            // We have a monomorphic type check upstream. Check against initial/final type.
            const JITTypeHolder valueType(valueInfo->GetJsType());
            if (valueType == opndType)
            {
                // The type on this instruction matches the live value in the value table, so there is no need to
                // refresh the value table.
                isSpecialized = true;
                if (isTypeCheckedOut)
                {
                    *isTypeCheckedOut = true;
                }
                if (consumeType)
                {
                    opnd->SetTypeChecked(true);
                }
            }
            else if (opnd->HasInitialType() && valueType == opnd->GetInitialType())
            {
                // Checked type matches the initial type at this store.
                bool objectMayHaveAcquiredAdditionalProperties =
                    block->globOptData.maybeWrittenTypeSyms &&
                    block->globOptData.maybeWrittenTypeSyms->Test(typeSym->m_id);
                if (consumeType)
                {
                    opnd->SetTypeChecked(!objectMayHaveAcquiredAdditionalProperties);
                    opnd->SetInitialTypeChecked(!objectMayHaveAcquiredAdditionalProperties);
                }
                if (produceType)
                {
                    SetObjectTypeFromTypeSym(typeSym, opndType, nullptr, block, updateExistingValue);
                }
                isSpecialized = !isTypeDead || !objectMayHaveAcquiredAdditionalProperties;
                emitsTypeCheck = isSpecialized && objectMayHaveAcquiredAdditionalProperties;
                addsProperty = isSpecialized;
                if (isTypeCheckedOut)
                {
                    *isTypeCheckedOut = !objectMayHaveAcquiredAdditionalProperties;
                }
            }
            else
            {
                // This must be a type mismatch situation, because the value is available, but doesn't match either
                // the current type or the initial type. We will not optimize this instruction and we do not produce
                // a new type value here.
                isSpecialized = false;

                if (makeChanges)
                {
                    opnd->SetTypeMismatch(true);
                }
            }
        }
        else
        {
            // We have an equivalent type check upstream, but we require a particular type at this point. We
            // can't treat it as "checked", but we may benefit from checking for the required type.
            Assert(valueInfo->GetJsTypeSet());
            Js::EquivalentTypeSet *valueTypeSet = valueInfo->GetJsTypeSet();
            if (valueTypeSet->Contains(opndType))
            {
                // Required type is in the type set we've checked. Check for the required type here, and
                // note in the value info that we've narrowed down to this type. (But leave the type set in the
                // value info so it can be merged with the same type set on other paths.)
                isSpecialized = !isTypeDead;
                emitsTypeCheck = isSpecialized;
                if (produceType)
                {
                    SetSingleTypeOnObjectTypeValue(value, opndType);
                }
            }
            else if (opnd->HasInitialType() && valueTypeSet->Contains(opnd->GetInitialType()))
            {
                // Required initial type is in the type set we've checked. Check for the initial type here, and
                // note in the value info that we've narrowed down to this type. (But leave the type set in the
                // value info so it can be merged with the same type set on other paths.)
                isSpecialized = !isTypeDead;
                emitsTypeCheck = isSpecialized;
                addsProperty = isSpecialized;
                if (produceType)
                {
                    SetSingleTypeOnObjectTypeValue(value, opndType);
                }
            }
            else
            {
                // This must be a type mismatch situation, because the value is available, but doesn't match either
                // the current type or the initial type. We will not optimize this instruction and we do not produce
                // a new type value here.
                isSpecialized = false;

                if (makeChanges)
                {
                    opnd->SetTypeMismatch(true);
                }
            }
        }
    }
    else
    {
        Assert(!opnd->NeedsMonoCheck());

        Js::EquivalentTypeSet * opndTypeSet = opnd->GetEquivalentTypeSet();
        uint16 checkedTypeSetIndex = (uint16)-1;

        if (opnd->NeedsDepolymorphication())
        {
            // The opnd's type set (opndTypeSet) is non-equivalent. Test all the types coming from the valueInfo.
            // If all of them are contained in opndTypeSet, and all of them have the same slot index in opnd's
            // objtypespecfldinfo, then we can use that slot index and treat the set as equivalent.
            // (Also test whether all types do/don't use aux slots.)

            uint16 slotIndex = Js::Constants::NoSlot;
            bool auxSlot = false;

            // Do this work only if there is an upstream type value. We don't attempt to do a type check based on
            // a non-equivalent set.
            if (valueInfo != nullptr)
            {
                if (valueInfo->GetJsType() != nullptr)
                {
                    opnd->TryDepolymorphication(valueInfo->GetJsType(), Js::Constants::NoSlot, false, &slotIndex, &auxSlot, &checkedTypeSetIndex);
                }
                else if (valueInfo->GetJsTypeSet() != nullptr)
                {
                    Js::EquivalentTypeSet *typeSet = valueInfo->GetJsTypeSet();
                    for (uint16 i = 0; i < typeSet->GetCount(); i++)
                    {
                        opnd->TryDepolymorphication(typeSet->GetType(i), slotIndex, auxSlot, &slotIndex, &auxSlot);
                        if (slotIndex == Js::Constants::NoSlot)
                        {
                            // Indicates failure/mismatch. We're done.
                            break;
                        }
                    }
                }
            }

            if (slotIndex == Js::Constants::NoSlot)
            {
                // Indicates failure/mismatch
                isSpecialized = false;
                if (makeChanges)
                {
                    opnd->SetTypeMismatch(true);
                }
            }
            else
            {
                // Indicates we can optimize, as all upstream types are equivalent here.

                isSpecialized = true;
                if (isTypeCheckedOut)
                {
                    *isTypeCheckedOut = true;
                }
                if (consumeType)
                {
                    opnd->SetTypeChecked(true);

                    opnd->SetSlotIndex(slotIndex);
                    opnd->SetUsesAuxSlot(auxSlot);

                    opnd->GetObjTypeSpecInfo()->SetSlotIndex(slotIndex);
                    opnd->GetObjTypeSpecInfo()->SetUsesAuxSlot(auxSlot);

                    if (checkedTypeSetIndex != (uint16)-1)
                    {
                        opnd->SetCheckedTypeSetIndex(checkedTypeSetIndex);
                    }
                }
            }
        }
        else if (valueInfo == nullptr || (valueInfo->GetJsType() == nullptr && valueInfo->GetJsTypeSet() == nullptr))
        {
            // If we don't have a value for the type we will have to emit a type check and we produce a new type value here.
            if (produceType)
            {
                if (opnd->IsMono())
                {
                    SetObjectTypeFromTypeSym(typeSym, opnd->GetFirstEquivalentType(), nullptr, block, updateExistingValue);
                }
                else
                {
                    SetObjectTypeFromTypeSym(typeSym, nullptr, opndTypeSet, block, updateExistingValue);
                }
            }
            isSpecialized = !isTypeDead;
            emitsTypeCheck = isSpecialized;
        }
        else if (valueInfo->GetJsType() != nullptr ?
                 opndTypeSet->Contains(valueInfo->GetJsType(), &checkedTypeSetIndex) :
                 IsSubsetOf(valueInfo->GetJsTypeSet(), opndTypeSet))
        {
            // All the types in the value info are contained in the set required by this access,
            // meaning that they're equivalent to the opnd's type set.
            // We won't have a type check, and we don't need to touch the type value.
            isSpecialized = true;
            if (isTypeCheckedOut)
            {
                *isTypeCheckedOut = true;
            }
            if (consumeType)
            {
                opnd->SetTypeChecked(true);
            }
            if (checkedTypeSetIndex != (uint16)-1)
            {
                opnd->SetCheckedTypeSetIndex(checkedTypeSetIndex);
            }
        }
        else if (valueInfo->GetJsTypeSet() &&
                 (opnd->IsMono() ?
                      valueInfo->GetJsTypeSet()->Contains(opnd->GetFirstEquivalentType()) :
                      IsSubsetOf(opndTypeSet, valueInfo->GetJsTypeSet())
                 )
            )
        {
            // We have an equivalent type check upstream, but we require a tighter type check at this point.
            // We can't treat the operand as "checked", but check for equivalence with the tighter set and update the
            // value info.
            if (produceType)
            {
                if (opnd->IsMono())
                {
                    SetObjectTypeFromTypeSym(typeSym, opnd->GetFirstEquivalentType(), nullptr, block, updateExistingValue);
                }
                else
                {
                    SetObjectTypeFromTypeSym(typeSym, nullptr, opndTypeSet, block, updateExistingValue);
                }
            }
            isSpecialized = !isTypeDead;
            emitsTypeCheck = isSpecialized;
        }
        else
        {
            // This must be a type mismatch situation, because the value is available, but doesn't match either
            // the current type or the initial type. We will not optimize this instruction and we do not produce
            // a new type value here.
            isSpecialized = false;

            if (makeChanges)
            {
                opnd->SetTypeMismatch(true);
            }
        }
    }

    Assert(isSpecialized || (!emitsTypeCheck && !addsProperty));

    if (consumeType && opnd->MayNeedWriteGuardProtection())
    {
        Assert(!isStore);
        PropertySym *propertySym = opnd->m_sym->AsPropertySym();
        Assert(propertySym->m_writeGuardSym);
        opnd->SetWriteGuardChecked(!!block->globOptData.liveFields->Test(propertySym->m_writeGuardSym->m_id));
    }

    // Even specialized property adds must kill all types for other property adds. That's because any other object sym
    // may, in fact, be an alias of the instance whose type is being modified here. (see Windows Blue Bug 541876)
    if (makeChanges && addsProperty)
    {
        Assert(isStore && isSpecialized);
        Assert(this->objectTypeSyms != nullptr);
        Assert(this->objectTypeSyms->Test(typeSym->m_id));

        if (block->globOptData.maybeWrittenTypeSyms == nullptr)
        {
            block->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
        }

        this->objectTypeSyms->Clear(typeSym->m_id);
        block->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
        this->objectTypeSyms->Set(typeSym->m_id);
    }

    if (produceType && emitsTypeCheck && opnd->IsMono())
    {
        // Consider (ObjTypeSpec): Represent maybeWrittenTypeSyms as a flag on value info of the type sym.
        if (block->globOptData.maybeWrittenTypeSyms != nullptr)
        {
            // We're doing a type check here, so objtypespec of property adds is safe for this type
            // from this point forward.
            block->globOptData.maybeWrittenTypeSyms->Clear(typeSym->m_id);
        }
    }

    // Consider (ObjTypeSpec): Enable setting write guards live on instructions hoisted out of loops. Note that produceType
    // is false if the type values on loop back edges don't match (see earlier comments).
    // This means that hoisted instructions won't set write guards live if the type changes in the loop, even if
    // the corresponding properties have not been written inside the loop. This may result in some unnecessary type
    // checks and bailouts inside the loop. To enable this, we would need to verify the write guards are still live
    // on the back edge (much like we're doing for types above).

    // Consider (ObjTypeSpec): Support polymorphic write guards as well. We can't currently distinguish between mono and
    // poly write guards, and a type check can only protect operations matching with respect to polymorphism (see
    // BackwardPass::TrackObjTypeSpecProperties for details), so for now we only target monomorphic operations.
    if (produceType && emitsTypeCheck && opnd->IsMono())
    {
        // If the type check we'll emit here protects some property operations that require a write guard (i.e.
        // they must do an extra type check and property guard check, if they have been written to in this
        // function), let's mark the write guards as live here, so we can accurately track if their properties
        // have been written to. Make sure we only set those that we'll actually guard, i.e. those that match
        // with respect to polymorphism.
        if (opnd->GetWriteGuards() != nullptr)
        {
            block->globOptData.liveFields->Or(opnd->GetWriteGuards());
        }
    }

    if (makeChanges && isTypeDead)
    {
        this->KillObjectType(opnd->GetObjectSym(), block->globOptData.liveFields);
    }

#if DBG
    if (!makeChanges)
    {
        uint16 typeCheckSeqFlagsAfter = opnd->GetTypeCheckSeqFlags();
        Assert(typeCheckSeqFlagsBefore == typeCheckSeqFlagsAfter);

        Value* valueAfter = block->globOptData.FindObjectTypeValue(typeSym);
        Assert(valueBefore == valueAfter);
        if (valueAfter != nullptr)
        {
            Assert(valueBefore != nullptr);
            Assert(valueAfter->GetValueInfo() != nullptr && valueAfter->GetValueInfo()->IsJsType());
            JsTypeValueInfo* valueInfoAfter = valueAfter->GetValueInfo()->AsJsType();
            Assert(valueInfoBefore == valueInfoAfter);
            Assert(valueInfoBefore->GetJsType() == valueInfoAfter->GetJsType());
            Assert(valueInfoBefore->GetJsTypeSet() == valueInfoAfter->GetJsTypeSet());
        }
    }
#endif

    if (emitsTypeCheckOut != nullptr)
    {
        *emitsTypeCheckOut = emitsTypeCheck;
    }

    if (changesTypeValueOut != nullptr)
    {
        *changesTypeValueOut = isSpecialized && (emitsTypeCheck || addsProperty);
    }

    if (makeChanges)
    {
        // Track liveness of aux slot ptr syms.
        if (!PHASE_OFF(Js::ReuseAuxSlotPtrPhase, this->func) && isSpecialized)
        {
            if (opnd->UsesAuxSlot() && !opnd->IsLoadedFromProto())
            {
                // Optimized ld/st that loads/uses an aux slot ptr.
                // Aux slot sym is live forward.
                StackSym *auxSlotPtrSym = this->EnsureAuxSlotPtrSym(opnd);
                if (!this->IsLoopPrePass() && opnd->IsTypeChecked())
                {
                    if (block->globOptData.liveFields->TestAndSet(auxSlotPtrSym->m_id))
                    {
                        // Aux slot sym is available here. Tell lowerer to use it.
                        opnd->SetAuxSlotPtrSymAvailable(true);
                    }
                }
                else
                {
                    block->globOptData.liveFields->Set(auxSlotPtrSym->m_id);
                }
            }
            else if (!opnd->IsTypeChecked())
            {
                // Type sym is not available here (i.e., object shape is not known) and we're not loading the aux slots.
                // May get here with aux slot sym still in live set if type sym is not in the value table.
                // Clear the aux slot sym out of the live set.
                StackSym *auxSlotPtrSym = opnd->GetAuxSlotPtrSym();
                if (auxSlotPtrSym)
                {
                    block->globOptData.liveFields->Clear(auxSlotPtrSym->m_id);
                }
            }
        }
    }

    return isSpecialized;
}